

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::DescriptorProto(DescriptorProto *this,DescriptorProto *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  MessageOptions *this_01;
  DescriptorProto *from_local;
  DescriptorProto *this_local;
  Container *local_28;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_006fb450;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            (&this->field_,&from->field_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField
            (&this->nested_type_,&from->nested_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField
            (&this->enum_type_,&from->enum_type_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::RepeatedPtrField
            (&this->extension_range_,&from->extension_range_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            (&this->extension_,&from->extension_);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::RepeatedPtrField
            (&this->oneof_decl_,&from->oneof_decl_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::RepeatedPtrField
            (&this->reserved_range_,&from->reserved_range_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->reserved_name_,&from->reserved_name_);
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,psVar2);
  bVar1 = has_name(from);
  if (bVar1) {
    psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    internal::ArenaStringPtr::AssignWithDefault(&this->name_,psVar2,(from->name_).ptr_);
  }
  bVar1 = has_options(from);
  if (bVar1) {
    this_01 = (MessageOptions *)operator_new(0x70);
    MessageOptions::MessageOptions(this_01,from->options_);
    this->options_ = this_01;
  }
  else {
    this->options_ = (MessageOptions *)0x0;
  }
  return;
}

Assistant:

DescriptorProto::DescriptorProto(const DescriptorProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      field_(from.field_),
      nested_type_(from.nested_type_),
      enum_type_(from.enum_type_),
      extension_range_(from.extension_range_),
      extension_(from.extension_),
      oneof_decl_(from.oneof_decl_),
      reserved_range_(from.reserved_range_),
      reserved_name_(from.reserved_name_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.has_options()) {
    options_ = new ::google::protobuf::MessageOptions(*from.options_);
  } else {
    options_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.DescriptorProto)
}